

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

Vector2f __thiscall Rml::Box::GetPosition(Box *this,BoxArea area)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  int local_20;
  int i;
  BoxArea area_local;
  Box *this_local;
  Vector2f area_position;
  
  if ((area == Auto) &&
     (bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x29), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  fVar4 = GetEdge(this,Margin,Left);
  fVar5 = GetEdge(this,Margin,Top);
  Vector2<float>::Vector2((Vector2<float> *)&this_local,-fVar4,-fVar5);
  for (local_20 = 0; local_20 < (int)area; local_20 = local_20 + 1) {
    this_local._0_4_ = this->area_edges[local_20][3] + this_local._0_4_;
    this_local._4_4_ = this->area_edges[local_20][0] + this_local._4_4_;
  }
  VVar2.y = this_local._4_4_;
  VVar2.x = this_local._0_4_;
  return VVar2;
}

Assistant:

Vector2f Box::GetPosition(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_position(-GetEdge(BoxArea::Margin, BoxEdge::Left), -GetEdge(BoxArea::Margin, BoxEdge::Top));
	for (int i = 0; i < (int)area; i++)
	{
		area_position.x += area_edges[i][(int)BoxEdge::Left];
		area_position.y += area_edges[i][(int)BoxEdge::Top];
	}

	return area_position;
}